

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeWidgetItem::setData(QTreeWidgetItem *this,int column,int role,QVariant *value)

{
  QList<QList<QWidgetItemData>_> *this_00;
  uint uVar1;
  QList<QWidgetItemData> *pQVar2;
  ulong uVar3;
  undefined8 uVar4;
  char cVar5;
  QTreeModel *this_01;
  long lVar6;
  pointer pQVar7;
  pointer pQVar8;
  pointer pQVar9;
  long lVar10;
  QTreeWidgetItemPrivate *pQVar11;
  long lVar12;
  QVariantList *this_02;
  int iVar13;
  ulong uVar14;
  QTreeWidgetItem *pQVar15;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QWidgetItemData> local_80;
  undefined1 local_68 [8];
  QVariant QStack_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (column < 0) goto LAB_005b104f;
  uVar3 = (ulong)(uint)column;
  this_01 = treeModel(this,(QTreeWidget *)0x0);
  if (role == 0) {
LAB_005b0bf9:
    if ((ulong)(this->values).d.size <= uVar3) {
      if ((this_01 == (QTreeModel *)0x0) || (this_01->headerItem != this)) {
        QList<QList<QWidgetItemData>_>::resize(&this->values,(ulong)(column + 1));
      }
      else {
        QTreeModel::setColumnCount(this_01,column + 1);
      }
    }
    pQVar11 = this->d;
    uVar14 = (pQVar11->display).d.size;
    if (uVar3 < uVar14) {
      pQVar8 = QList<QVariant>::data(&pQVar11->display);
      cVar5 = ::QVariant::equals(pQVar8 + uVar3);
      if (cVar5 != '\0') goto LAB_005b104f;
      pQVar8 = QList<QVariant>::data(&this->d->display);
      ::QVariant::operator=(pQVar8 + uVar3,value);
    }
    else {
      iVar13 = column - (uint)uVar14;
      if ((uint)uVar14 <= (uint)column && iVar13 != 0) {
        do {
          local_68 = (undefined1  [8])0x0;
          QStack_60.d.data._0_8_ = (int *)0x0;
          QStack_60.d.data._8_8_ = 0;
          QStack_60.d.data._16_8_ = 2;
          this_02 = &this->d->display;
          QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                    ((QMovableArrayOps<QVariant> *)this_02,(this->d->display).d.size,
                     (QVariant *)local_68);
          QList<QVariant>::end(this_02);
          ::QVariant::~QVariant((QVariant *)local_68);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
        pQVar11 = this->d;
        uVar14 = (pQVar11->display).d.size;
      }
      QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant_const&>
                ((QMovableArrayOps<QVariant> *)&pQVar11->display,uVar14,value);
      QList<QVariant>::end(&pQVar11->display);
    }
  }
  else {
    if (role == 10) {
      if (((this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
           super_QFlagsStorage<Qt::ItemFlag>.i & 0x40) != 0) {
        ::QVariant::QVariant((QVariant *)local_68,1);
        cVar5 = ::QVariant::equals(value);
        ::QVariant::~QVariant((QVariant *)local_68);
        if ((cVar5 == '\0') && ((this->children).d.size != 0)) {
          uVar14 = 0;
          do {
            pQVar15 = (this->children).d.ptr[uVar14];
            (*pQVar15->_vptr_QTreeWidgetItem[3])((QVariant *)local_68,pQVar15,uVar3,10);
            uVar4 = QStack_60.d.data._16_8_;
            ::QVariant::~QVariant((QVariant *)local_68);
            if (3 < (ulong)uVar4) {
              uVar1 = (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                      super_QFlagsStorage<Qt::ItemFlag>.i;
              (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
              super_QFlagsStorage<Qt::ItemFlag>.i = uVar1 & 0xffffffbf;
              (*pQVar15->_vptr_QTreeWidgetItem[4])(pQVar15,uVar3,10,value);
              (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
              super_QFlagsStorage<Qt::ItemFlag>.i = uVar1;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)(this->children).d.size);
        }
      }
    }
    else if (role == 2) goto LAB_005b0bf9;
    this_00 = &this->values;
    if (uVar3 < (ulong)(this->values).d.size) {
      pQVar2 = (this->values).d.ptr;
      local_80.d = pQVar2[uVar3].d.d;
      local_80.ptr = pQVar2[uVar3].d.ptr;
      local_80.size = pQVar2[uVar3].d.size;
      if (&(local_80.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_80.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_80.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_80.size != 0) {
        lVar12 = -8;
        lVar10 = 0;
        lVar6 = local_80.size;
        do {
          if (*(int *)((long)&(local_80.ptr)->role + lVar10) == role) {
            cVar5 = ::QVariant::equals((QVariant *)((long)local_80.ptr - lVar12));
            if (cVar5 == '\0') {
              pQVar7 = QList<QList<QWidgetItemData>_>::data(this_00);
              pQVar9 = QList<QWidgetItemData>::data(pQVar7 + uVar3);
              ::QVariant::operator=((QVariant *)((long)pQVar9 - lVar12),value);
              goto LAB_005b0d98;
            }
            QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_80);
            goto LAB_005b104f;
          }
          lVar12 = lVar12 + -0x28;
          lVar10 = lVar10 + 0x28;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      pQVar7 = QList<QList<QWidgetItemData>_>::data(this_00);
      pQVar2 = pQVar7 + uVar3;
      local_68._0_4_ = role;
      ::QVariant::QVariant(&QStack_60,value);
      QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
                ((QMovableArrayOps<QWidgetItemData> *)pQVar2,(pQVar2->d).size,
                 (QWidgetItemData *)local_68);
      QList<QWidgetItemData>::end(pQVar2);
      ::QVariant::~QVariant(&QStack_60);
LAB_005b0d98:
      QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_80);
    }
    else {
      if ((this_01 == (QTreeModel *)0x0) || (this_01->headerItem != this)) {
        QList<QList<QWidgetItemData>_>::resize(this_00,(ulong)(column + 1));
      }
      else {
        QTreeModel::setColumnCount(this_01,column + 1);
      }
      pQVar7 = QList<QList<QWidgetItemData>_>::data(this_00);
      pQVar2 = pQVar7 + uVar3;
      local_68._0_4_ = role;
      ::QVariant::QVariant(&QStack_60,value);
      QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
                ((QMovableArrayOps<QWidgetItemData> *)pQVar2,(pQVar2->d).size,
                 (QWidgetItemData *)local_68);
      QList<QWidgetItemData>::end(pQVar2);
      ::QVariant::~QVariant(&QStack_60);
    }
  }
  if (this_01 != (QTreeModel *)0x0) {
    QStack_60.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QStack_60.d.data._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if ((role & 0xfffffffdU) == 0) {
      local_80.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_60.d.data.shared =
           (PrivateShared *)QArrayData::allocate((QArrayData **)&local_80,4,0x10,2,KeepSize);
      local_68 = (undefined1  [8])local_80.d;
      *(int *)((long)QStack_60.d.data.shared + 0) = 0;
      *(int *)((long)QStack_60.d.data.shared + 4) = 2;
      QStack_60.d.data._8_8_ = 2;
      QTreeModel::emitDataChanged(this_01,this,column,(QList<int> *)local_68);
    }
    else {
      local_80.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_60.d.data.shared =
           (PrivateShared *)QArrayData::allocate((QArrayData **)&local_80,4,0x10,1,KeepSize);
      local_68 = (undefined1  [8])local_80.d;
      *(int *)QStack_60.d.data.shared = role;
      QStack_60.d.data._8_8_ = 1;
      QTreeModel::emitDataChanged(this_01,this,column,(QList<int> *)local_68);
      pQVar15 = this->par;
      if (pQVar15 != (QTreeWidgetItem *)0x0 && role == 10) {
        do {
          if (((pQVar15->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
               super_QFlagsStorage<Qt::ItemFlag>.i & 0x40) == 0) break;
          QTreeModel::emitDataChanged(this_01,pQVar15,column,(QList<int> *)local_68);
          pQVar15 = pQVar15->par;
        } while (pQVar15 != (QTreeWidgetItem *)0x0);
      }
    }
    if (local_68 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)local_68 = *(int *)local_68 + -1;
      UNLOCK();
      if (*(int *)local_68 == 0) {
        QArrayData::deallocate((QArrayData *)local_68,4,0x10);
      }
    }
  }
LAB_005b104f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::setData(int column, int role, const QVariant &value)
{
    if (column < 0)
        return;

    QTreeModel *model = treeModel();
    switch (role) {
    case Qt::EditRole:
    case Qt::DisplayRole: {
        if (values.size() <= column) {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
        }
        if (d->display.size() <= column) {
            for (int i = d->display.size() - 1; i < column - 1; ++i)
                d->display.append(QVariant());
            d->display.append(value);
        } else if (d->display[column] != value) {
            d->display[column] = value;
        } else {
            return; // value is unchanged
        }
    } break;
    case Qt::CheckStateRole:
        if ((itemFlags & Qt::ItemIsAutoTristate) && value != Qt::PartiallyChecked) {
            for (int i = 0; i < children.size(); ++i) {
                QTreeWidgetItem *child = children.at(i);
                if (child->data(column, role).isValid()) {// has a CheckState
                    Qt::ItemFlags f = itemFlags; // a little hack to avoid multiple dataChanged signals
                    itemFlags &= ~Qt::ItemIsAutoTristate;
                    child->setData(column, role, value);
                    itemFlags = f;
                }
            }
        }
        Q_FALLTHROUGH();
    default:
        if (column < values.size()) {
            bool found = false;
            const QList<QWidgetItemData> column_values = values.at(column);
            for (int i = 0; i < column_values.size(); ++i) {
                if (column_values.at(i).role == role) {
                    if (column_values.at(i).value == value)
                        return; // value is unchanged
                    values[column][i].value = value;
                    found = true;
                    break;
                }
            }
            if (!found)
                values[column].append(QWidgetItemData(role, value));
        } else {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
            values[column].append(QWidgetItemData(role, value));
        }
    }

    if (model) {
        const QList<int> roles((role == Qt::DisplayRole || role == Qt::EditRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->emitDataChanged(this, column, roles);
        if (role == Qt::CheckStateRole) {
            QTreeWidgetItem *p;
            for (p = par; p && (p->itemFlags & Qt::ItemIsAutoTristate); p = p->par)
                model->emitDataChanged(p, column, roles);
        }
    }
}